

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O0

void __thiscall
cmFileInstaller::ReportCopy(cmFileInstaller *this,string *toFile,Type type,bool copy)

{
  char *local_c0;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  undefined1 local_40 [8];
  string message;
  bool copy_local;
  Type type_local;
  string *toFile_local;
  cmFileInstaller *this_local;
  
  message.field_2._M_local_buf[0xb] = copy;
  message.field_2._12_4_ = type;
  if (((this->MessageNever & 1U) == 0) && ((copy || ((this->MessageLazy & 1U) == 0)))) {
    if (copy) {
      local_c0 = "Installing: ";
    }
    else {
      local_c0 = "Up-to-date: ";
    }
    cmAlphaNum::cmAlphaNum(&local_70,local_c0);
    cmAlphaNum::cmAlphaNum(&local_a0,toFile);
    cmStrCat<>((string *)local_40,&local_70,&local_a0);
    cmMakefile::DisplayStatus((this->super_cmFileCopier).Makefile,(string *)local_40,-1.0);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (message.field_2._12_4_ != 1) {
    ManifestAppend(this,toFile);
  }
  return;
}

Assistant:

void cmFileInstaller::ReportCopy(const std::string& toFile, Type type,
                                 bool copy)
{
  if (!this->MessageNever && (copy || !this->MessageLazy)) {
    std::string message =
      cmStrCat((copy ? "Installing: " : "Up-to-date: "), toFile);
    this->Makefile->DisplayStatus(message, -1);
  }
  if (type != TypeDir) {
    // Add the file to the manifest.
    this->ManifestAppend(toFile);
  }
}